

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

bool crnlib::rg_etc1::unpack_etc2_alpha(void *pBlock,uint *pDst_pixels_rgba,int comp_index)

{
  byte bVar1;
  byte bVar2;
  sbyte sVar3;
  int iVar4;
  int in_EDX;
  long in_RSI;
  byte *in_RDI;
  int s;
  int bit_offset;
  int byte_offset;
  uint j;
  uint d;
  uint i_1;
  uint d0;
  int i;
  int multiplier;
  int base_codeword;
  uint8 values [8];
  int *modifier;
  uint8 *B;
  color_quad_u8 *pDst;
  uint local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  int local_44;
  undefined1 auStack_38 [8];
  undefined1 *local_30;
  byte *local_28;
  long local_20;
  int local_14;
  
  local_30 = g_etc2a_modifier_table + (long)(int)(in_RDI[1] & 0xf) * 0x20;
  bVar1 = *in_RDI;
  bVar2 = in_RDI[1];
  local_28 = in_RDI;
  local_20 = in_RSI;
  local_14 = in_EDX;
  for (local_44 = 0; local_44 < 8; local_44 = local_44 + 1) {
    iVar4 = math::clamp<int>((uint)bVar1 +
                             *(int *)(local_30 + (long)local_44 * 4) * ((int)(uint)bVar2 >> 4),0,
                             0xff);
    auStack_38[local_44] = (char)iVar4;
  }
  local_48 = 3;
  for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
    local_50 = local_48;
    for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
      sVar3 = (sbyte)(local_50 & 7);
      local_60 = (int)(uint)local_28[(int)((local_50 >> 3) + 2)] >> (8U - sVar3 & 0x1f) & 7;
      if ((local_50 & 7) < 3) {
        local_60 = (uint)local_28[(int)((local_50 >> 3) + 1)] << sVar3 & 7 | local_60;
      }
      *(undefined1 *)(local_20 + local_14) = auStack_38[(int)local_60];
      local_20 = local_20 + 4;
      local_50 = local_50 + 0xc;
    }
    local_48 = local_48 + 3;
  }
  return true;
}

Assistant:

bool unpack_etc2_alpha(const void* pBlock, unsigned int* pDst_pixels_rgba, int comp_index) {
  color_quad_u8* pDst = (color_quad_u8*)pDst_pixels_rgba;
  const uint8* B = (const uint8*)pBlock;
  const int* modifier = g_etc2a_modifier_table[B[1] & 0xF];
  uint8 values[8];
  for (int base_codeword = B[0], multiplier = B[1] >> 4, i = 0; i < 8; i++)
    values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
  for (uint d0 = 3, i = 0; i < 4; i++, d0 += 3) {
    for (uint d = d0, j = 0; j < 4; j++, pDst++, d += 12) {
      int byte_offset = 2 + (d >> 3);
      int bit_offset = d & 7;
      int s = B[byte_offset] >> (8 - bit_offset) & 7;
      if (bit_offset < 3)
        s |= B[byte_offset - 1] << bit_offset & 7;
      pDst->c[comp_index] = values[s];
    }
  }
  return true;
}